

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

char fmt::v7::detail::thousands_sep_impl<char>(locale_ref loc)

{
  char cVar1;
  locale local_18 [8];
  void *local_10;
  locale_ref loc_local;
  
  local_10 = loc.locale_;
  locale_ref::get<std::locale>((locale_ref *)local_18);
  std::use_facet<std::__cxx11::numpunct<char>>(local_18);
  cVar1 = std::__cxx11::numpunct<char>::thousands_sep();
  std::locale::~locale(local_18);
  return cVar1;
}

Assistant:

FMT_FUNC Char thousands_sep_impl(locale_ref loc) {
  return std::use_facet<std::numpunct<Char>>(loc.get<std::locale>())
      .thousands_sep();
}